

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

bool ON_Extrusion::CleanupPolyCurveProfile(ON_PolyCurve *polycurve)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint i;
  int iVar4;
  int iVar5;
  ON_Curve *pOVar6;
  ON_PolyCurve *this;
  uint segment_index;
  long lVar7;
  ON_PolyCurve *new_segment;
  ON_Curve *old_segment;
  ON_SimpleArray<ON_PolyCurve_*> new_polycurves;
  ON_SimpleArray<ON_Curve_*> new_segments;
  ON_PolyCurve *local_78;
  ON_Curve *local_70;
  ON_SimpleArray<ON_PolyCurve_*> local_68;
  ON_SimpleArray<ON_Curve_*> local_50;
  ON_PolyCurve *local_38;
  
  bVar3 = IsValidPolyCurveProfile(polycurve,(ON_TextLog *)0x0);
  if (bVar3) {
    (*(polycurve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])
              (polycurve,2);
  }
  else {
    i = ON_PolyCurve::Count(polycurve);
    segment_index = 0;
    if ((int)i < 2) goto LAB_003c500c;
    do {
      pOVar6 = ON_PolyCurve::SegmentCurve(polycurve,segment_index);
      if ((pOVar6 == (ON_Curve *)0x0) ||
         ((iVar4 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pOVar6),
          iVar4 != 2 &&
          (iVar4 = (*(pOVar6->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pOVar6,2),
          (char)iVar4 == '\0')))) goto LAB_003c5009;
      segment_index = segment_index + 1;
    } while (i != segment_index);
    ON_PolyCurve::SynchronizeSegmentDomains(polycurve);
    local_68._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081acf0;
    local_68.m_a = (ON_PolyCurve **)0x0;
    local_68.m_count = 0;
    local_68.m_capacity = 0;
    ON_SimpleArray<ON_PolyCurve_*>::SetCapacity(&local_68,(ulong)i);
    local_50._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081ad30;
    local_50.m_a = (ON_Curve **)0x0;
    local_50.m_count = 0;
    local_50.m_capacity = 0;
    ON_SimpleArray<ON_Curve_*>::SetCapacity(&local_50,(ulong)i);
    local_78 = (ON_PolyCurve *)0x0;
    iVar4 = 1;
    bVar3 = true;
    do {
      local_70 = ON_PolyCurve::SegmentCurve(polycurve,iVar4 + -1);
      iVar5 = (*(local_70->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(local_70);
      if ((char)iVar5 == '\0') {
        if (local_78 == (ON_PolyCurve *)0x0) {
          this = (ON_PolyCurve *)operator_new(0x40);
          ON_PolyCurve::ON_PolyCurve(this);
          local_78 = this;
          ON_SimpleArray<ON_PolyCurve_*>::Append(&local_68,&local_78);
          bVar2 = true;
          ON_PolyCurve::Append(local_78,local_70);
          bVar1 = bVar3;
        }
        else {
          ON_PolyCurve::Append(local_78,local_70);
          iVar5 = ON_PolyCurve::FindNextGap(local_78,0);
          bVar2 = false;
          bVar1 = false;
          if (iVar5 == 0) {
            iVar5 = (*(local_78->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                      [0x34])();
            bVar2 = true;
            bVar1 = bVar3;
            if ((char)iVar5 != '\0') {
              local_38 = local_78;
              ON_SimpleArray<ON_Curve_*>::Append(&local_50,(ON_Curve **)&local_38);
              local_78 = (ON_PolyCurve *)0x0;
            }
          }
        }
      }
      else {
        bVar2 = false;
        bVar1 = false;
        if (local_78 == (ON_PolyCurve *)0x0) {
          bVar2 = true;
          ON_SimpleArray<ON_Curve_*>::Append(&local_50,&local_70);
          bVar1 = bVar3;
        }
      }
    } while (((bVar2) && (iVar4 < (int)i)) && (iVar4 = iVar4 + 1, bVar3 = bVar1, bVar1));
    bVar1 = (bool)(local_78 == (ON_PolyCurve *)0x0 & bVar1);
    if (bVar1) {
      if (0 < local_68.m_count) {
        lVar7 = 0;
        do {
          ON_PolyCurve::RemoveNesting(local_68.m_a[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < local_68.m_count);
      }
      while (0 < (int)i) {
        i = i - 1;
        ON_PolyCurve::HarvestSegment(polycurve,i);
        ON_PolyCurve::Remove(polycurve,i);
      }
      if (0 < local_50.m_count) {
        lVar7 = 0;
        do {
          ON_PolyCurve::Append(polycurve,local_50.m_a[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < local_50.m_count);
      }
    }
    else if (0 < local_68.m_count) {
      lVar7 = 0;
      do {
        local_78 = local_68.m_a[lVar7];
        if (local_78 != (ON_PolyCurve *)0x0) {
          iVar4 = ON_PolyCurve::Count(local_78);
          while (0 < iVar4) {
            iVar4 = iVar4 + -1;
            ON_PolyCurve::HarvestSegment(local_78,iVar4);
          }
          if (local_78 != (ON_PolyCurve *)0x0) {
            (*(local_78->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_68.m_count);
    }
    ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&local_50);
    ON_SimpleArray<ON_PolyCurve_*>::~ON_SimpleArray(&local_68);
    if (!bVar1) {
LAB_003c5009:
      segment_index = 0;
      goto LAB_003c500c;
    }
  }
  segment_index = 1;
LAB_003c500c:
  return SUB41(segment_index,0);
}

Assistant:

bool ON_Extrusion::CleanupPolyCurveProfile( ON_PolyCurve& polycurve )
{
  if ( !ON_Extrusion::IsValidPolyCurveProfile(polycurve) )
  {
    // see if we can fix it
    int i;
    const int old_count = polycurve.Count();
    if ( old_count <= 1 )
      return false;

    // make segments 2d 
    for ( i = 0; i < old_count; i++ )
    {
      ON_Curve* old_segment = polycurve.SegmentCurve(i);
      if ( 0 == old_segment )
        return false;
      if ( 2 != old_segment->Dimension() && !old_segment->ChangeDimension(2) )
        return false;
    }

    // make segment domains match the polycurve's m_t[] array
    polycurve.SynchronizeSegmentDomains();

    // make each segment a closed curve
    ON_SimpleArray<ON_PolyCurve*> new_polycurves(old_count);
    ON_SimpleArray<ON_Curve*> new_segments(old_count);
    ON_PolyCurve* new_segment = 0;
    bool rc = true;
    for ( i = 0; i < old_count && rc; i++ )
    {
      ON_Curve* old_segment = polycurve.SegmentCurve(i);
      if ( old_segment->IsClosed() )
      {
        if ( 0 != new_segment )
        {
          rc = false;
          break;
        }
        new_segments.Append(old_segment);
      }
      else if ( 0 == new_segment )
      {
        new_segment = new ON_PolyCurve();
        new_polycurves.Append(new_segment);
        new_segment->Append(old_segment);
      }
      else
      {
        new_segment->Append(old_segment);
        if ( new_segment->FindNextGap(0) )
        {
          rc = false;
          break;
        }
        if ( new_segment->IsClosed() )
        {
          new_segments.Append(new_segment);
          new_segment = 0;
        }
      }
    }

    if ( 0 != new_segment )
    {
      rc = false;
    }

    if ( !rc )
    {
      // unable to fix polycurve. Delete the new stuff we allocated.
      for ( i = 0; i < new_polycurves.Count(); i++ )
      {
        new_segment = new_polycurves[i];
        if ( new_segment )
        {
          for ( int j =  new_segment->Count()-1; j >= 0; j-- )
          {
            new_segment->HarvestSegment(j); // do not delete parts of input polycurve
          }
          delete new_segment;
        }
      }
      return false;
    }

    for ( i = 0; i < new_polycurves.Count(); i++ )
    {
      new_polycurves[i]->RemoveNesting();
    }

    for ( i = old_count-1; i >= 0; i-- )
    {
      polycurve.HarvestSegment(i);
      polycurve.Remove(i);
    }
    for ( i = 0; i < new_segments.Count(); i++ )
    {
      polycurve.Append(new_segments[i]);
    }
  }
  else
  {
    polycurve.ChangeDimension(2);
  }
  return true;
}